

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall
sf::Shader::loadFromStream
          (Shader *this,InputStream *vertexShaderStream,InputStream *fragmentShaderStream)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> vertexShader;
  char *in_stack_00001070;
  char *in_stack_00001078;
  char *in_stack_00001080;
  Shader *in_stack_00001088;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  InputStream *in_stack_ffffffffffffff60;
  vector<char,_std::allocator<char>_> local_60;
  undefined4 local_48;
  vector<char,_std::allocator<char>_> local_38 [2];
  bool local_1;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x15bdfe);
  bVar1 = anon_unknown.dwarf_79ada::getStreamContents
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x15be97);
    bVar1 = anon_unknown.dwarf_79ada::getStreamContents
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      std::vector<char,_std::allocator<char>_>::operator[](local_38,0);
      std::vector<char,_std::allocator<char>_>::operator[](&local_60,0);
      in_stack_ffffffffffffff57 =
           compile(in_stack_00001088,in_stack_00001080,in_stack_00001078,in_stack_00001070);
      local_1 = (bool)in_stack_ffffffffffffff57;
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to read fragment shader from stream");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
    local_48 = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to read vertex shader from stream");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
    local_48 = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::loadFromStream(InputStream& vertexShaderStream, InputStream& fragmentShaderStream)
{
    // Read the vertex shader code from the stream
    std::vector<char> vertexShader;
    if (!getStreamContents(vertexShaderStream, vertexShader))
    {
        err() << "Failed to read vertex shader from stream" << std::endl;
        return false;
    }

    // Read the fragment shader code from the stream
    std::vector<char> fragmentShader;
    if (!getStreamContents(fragmentShaderStream, fragmentShader))
    {
        err() << "Failed to read fragment shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], NULL, &fragmentShader[0]);
}